

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void cppcms::json::details::generic_append<cppcms::json::details::stream_append>
               (char *begin,char *end,stream_append *a)

{
  byte bVar1;
  char acVar2 [8];
  size_t n;
  char *s;
  char buf [8];
  
  stream_append::append(a,'\"');
  builtin_strncpy(buf,"\\u00",5);
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
LAB_0010d030:
  acVar2 = buf;
  n = 0;
  do {
    if (begin + n == end) {
      stream_append::append(a,begin,(long)end - (long)begin);
      stream_append::append(a,'\"');
      return;
    }
    bVar1 = begin[n];
    switch(bVar1) {
    case 8:
      s = "\\b";
      goto LAB_0010d0cc;
    case 9:
      s = "\\t";
      goto LAB_0010d0cc;
    case 10:
      s = "\\n";
      goto LAB_0010d0cc;
    case 0xb:
      goto switchD_0010d053_caseD_b;
    case 0xc:
      s = "\\f";
      goto LAB_0010d0cc;
    case 0xd:
      s = "\\r";
      goto LAB_0010d0cc;
    }
    if (bVar1 == 0x22) {
      s = "\\\"";
      goto LAB_0010d0cc;
    }
    if (bVar1 == 0x5c) {
      s = "\\\\";
      goto LAB_0010d0cc;
    }
switchD_0010d053_caseD_b:
    if (bVar1 < 0x20) break;
    n = n + 1;
  } while( true );
  buf[4] = "0123456789abcdef"[bVar1 >> 4];
  buf[5] = "0123456789abcdef"[bVar1 & 0xf];
  buf[7] = acVar2[7];
  buf[6] = '\0';
  s = buf;
LAB_0010d0cc:
  stream_append::append(a,begin,n);
  stream_append::append(a,s);
  begin = begin + n + 1;
  goto LAB_0010d030;
}

Assistant:

void generic_append(char const *begin,char const *end,Appender &a)
		{
			a.append('"');
			char const *i,*last;
			char buf[8] = "\\u00";
			for(i=begin,last = begin;i!=end;) {
				char const *addon = 0;
				unsigned char c=*i;
				switch(c) {
				case 0x22: addon = "\\\""; break;
				case 0x5C: addon = "\\\\"; break;
				case '\b': addon = "\\b"; break;
				case '\f': addon = "\\f"; break;
				case '\n': addon = "\\n"; break;
				case '\r': addon = "\\r"; break;
				case '\t': addon = "\\t"; break;
				default:
					if(c<=0x1F) {
						static char const tohex[]="0123456789abcdef";
						buf[4]=tohex[c >>  4];
						buf[5]=tohex[c & 0xF];
						buf[6]=0;
						addon = buf;
					}
				};
				if(addon) {
					a.append(last,i-last);
					a.append(addon);
					i++;
					last = i;
				}
				else {
					i++;
				}
			}
			a.append(last,i-last);
			a.append('"');
		}